

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::
format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
::on_format_specs(format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *this_00;
  undefined1 value [16];
  undefined1 value_00 [16];
  handle handle;
  basic_string_view<char> value_01;
  char *pcVar1;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *ctx;
  format_arg arg;
  unkbyte10 in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff72;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined2 uStack_70;
  undefined6 uStack_6e;
  int local_68;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_58;
  
  this_00 = &this->context;
  get_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,int>
            ((format_arg *)(local_88 + 0x10),(detail *)this_00,
             (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)(ulong)(uint)id,(int)end);
  if (local_68 == 0xf) {
    ctx = &this->parse_context;
    advance_to<char,fmt::v7::detail::error_handler>(ctx,begin);
    if (local_68 == 0xf) {
      (*(code *)CONCAT62(uStack_6e,uStack_70))(CONCAT44(uStack_74,local_78),ctx,this_00);
    }
    pcVar1 = (ctx->format_str_).data_;
  }
  else {
    local_88._0_4_ = 0;
    local_88._4_4_ = -1;
    local_88[8] = '\0';
    local_88[9] = 0;
    local_88[10] = ' ';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\x01';
    pcVar1 = begin + 1;
    if (((pcVar1 < end) && (*pcVar1 == '}')) && ((byte)((*begin & 0xdfU) + 0xbf) < 0x1a)) {
      local_88._9_3_ = 0x2000;
      local_88[8] = *begin;
    }
    else {
      local_58.
      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      .locale_.locale_ = &this->parse_context;
      local_58.
      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      .out_.container = (buffer<char> *)local_88;
      local_58.ctx_ = (context_type *)&local_58;
      local_58.parse_ctx_ =
           (basic_format_parse_context<char,_fmt::v7::detail::error_handler> *)
           CONCAT44(local_58.parse_ctx_._4_4_,local_68);
      local_58.
      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      .specs_ = (format_specs *)this_00;
      pcVar1 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                         (begin,end,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                           *)local_58.ctx_);
      if ((pcVar1 == end) || (*pcVar1 != '}')) {
        error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
    }
    local_58.parse_ctx_ = &this->parse_context;
    local_58.
    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
    .out_.container = (this->context).out_.container;
    local_58.
    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
    .locale_.locale_ = (this->context).loc_.locale_;
    local_58.
    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
    .specs_ = (format_specs *)local_88;
    local_58.ptr_ = (char *)0x0;
    local_58.ctx_ = this_00;
    switch(local_68) {
    case 1:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::write_int<int>(&local_58.
                        super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                       ,(int)local_78,
                       local_58.
                       super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                       .specs_);
      break;
    case 2:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_int>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,(uint)local_78,
                 local_58.
                 super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 .specs_);
      break;
    case 3:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::write_int<long_long>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,CONCAT44(uStack_74,local_78),
                 local_58.
                 super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 .specs_);
      break;
    case 4:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::write_int<unsigned_long_long>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,CONCAT44(uStack_74,local_78),
                 local_58.
                 super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 .specs_);
      break;
    case 5:
      value._10_6_ = in_stack_ffffffffffffff72;
      value._0_10_ = in_stack_ffffffffffffff68;
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::write_int<__int128>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,(__int128)value,(format_specs *)CONCAT44(uStack_74,local_78));
      break;
    case 6:
      value_00._10_6_ = in_stack_ffffffffffffff72;
      value_00._0_10_ = in_stack_ffffffffffffff68;
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>
      ::write_int<unsigned__int128>
                ((arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>
                  *)&local_58,(unsigned___int128)value_00,
                 (format_specs *)CONCAT44(uStack_74,local_78));
      break;
    case 7:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()(&local_58.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,local_78._0_1_);
      break;
    case 8:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()(&local_58.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,local_78._0_1_);
      break;
    case 9:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()<float,_0>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,local_78);
      break;
    case 10:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()<double,_0>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,(double)CONCAT44(uStack_74,local_78));
      break;
    case 0xb:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()<long_double,_0>
                (&local_58.
                  super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                 ,(longdouble)CONCAT28(uStack_70,CONCAT44(uStack_74,local_78)));
      break;
    case 0xc:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()(&local_58.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,(char *)CONCAT44(uStack_74,local_78));
      break;
    case 0xd:
      value_01.data_._4_4_ = uStack_74;
      value_01.data_._0_4_ = local_78;
      value_01.size_._0_2_ = uStack_70;
      value_01.size_._2_6_ = uStack_6e;
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()(&local_58.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,value_01);
      break;
    case 0xe:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()(&local_58.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,(void *)CONCAT44(uStack_74,local_78));
      break;
    case 0xf:
      handle.custom_.value._4_4_ = uStack_74;
      handle.custom_.value._0_4_ = local_78;
      handle.custom_.format._0_2_ = uStack_70;
      handle.custom_.format._2_6_ = uStack_6e;
      arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::operator()
                (&local_58,handle);
      break;
    default:
      arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      ::operator()(&local_58.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                  );
    }
  }
  return pcVar1;
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    auto arg = get_arg(context, id);
    if (arg.type() == type::custom_type) {
      advance_to(parse_context, begin);
      visit_format_arg(custom_formatter<Context>(parse_context, context), arg);
      return parse_context.begin();
    }
    auto specs = basic_format_specs<Char>();
    if (begin + 1 < end && begin[1] == '}' && is_ascii_letter(*begin)) {
      specs.type = static_cast<char>(*begin++);
    } else {
      using parse_context_t = basic_format_parse_context<Char>;
      specs_checker<specs_handler<parse_context_t, Context>> handler(
          specs_handler<parse_context_t, Context>(specs, parse_context,
                                                  context),
          arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
    }
    context.advance_to(visit_format_arg(
        arg_formatter<OutputIt, Char>(context, &parse_context, &specs), arg));
    return begin;
  }